

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_BrepLoop::IsValid(ON_BrepLoop *this,ON_TextLog *text_log)

{
  TYPE TVar1;
  int iVar2;
  int i;
  ON_TextLog *text_log_local;
  ON_BrepLoop *this_local;
  
  if (this->m_loop_index < 0) {
    BadLoopMessage(this->m_loop_index,text_log);
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"loop.m_loop_index < 0.\n");
    }
    this_local._7_1_ = ON_BrepIsNotValid();
  }
  else {
    iVar2 = ON_SimpleArray<int>::Count(&this->m_ti);
    if (iVar2 < 1) {
      BadLoopMessage(this->m_loop_index,text_log);
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"loop.m_ti[] is empty.\n");
      }
      this_local._7_1_ = ON_BrepIsNotValid();
    }
    else {
      TVar1 = this->m_type;
      if (((int)TVar1 < 0) || (6 < (int)TVar1)) {
        BadLoopMessage(this->m_loop_index,text_log);
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"loop.m_type = %d is not a valid value.\n",(ulong)TVar1);
        }
        this_local._7_1_ = ON_BrepIsNotValid();
      }
      else if (this->m_fi < 0) {
        BadLoopMessage(this->m_loop_index,text_log);
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"loop.m_fi = %d (should be >= 0 ).\n",(ulong)(uint)this->m_fi);
        }
        this_local._7_1_ = ON_BrepIsNotValid();
      }
      else if (this->m_brep == (ON_Brep *)0x0) {
        BadLoopMessage(this->m_loop_index,text_log);
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"loop.m_brep is nullptr.\n");
        }
        this_local._7_1_ = ON_BrepIsNotValid();
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BrepLoop::IsValid( ON_TextLog* text_log ) const
{
  if ( m_loop_index < 0 )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_loop_index < 0.\n");
    return ON_BrepIsNotValid();
  }

  if ( m_ti.Count() < 1 )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_ti[] is empty.\n");
    return ON_BrepIsNotValid();
  }
  int i = m_type;
  if ( i < 0 || i > type_count )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_type = %d is not a valid value.\n",i);
    return ON_BrepIsNotValid();
  }
  if ( m_fi < 0 )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_fi = %d (should be >= 0 ).\n",m_fi);
    return ON_BrepIsNotValid();
  }
  if ( !m_brep )
  {
    BadLoopMessage(m_loop_index,text_log);
    if ( text_log )
      text_log->Print("loop.m_brep is nullptr.\n");
    return ON_BrepIsNotValid();
  }
  return true;
}